

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall
SimpleParallelAnalyzerSettings::SetSettingsFromInterfaces(SimpleParallelAnalyzerSettings *this)

{
  uint uVar1;
  ulong uVar2;
  U32 i_1;
  ulong uVar3;
  U32 i;
  int iVar4;
  Channel *this_00;
  long lVar5;
  double dVar6;
  Channel local_88 [16];
  char text [64];
  
  uVar2 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  iVar4 = 0;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    uVar1 = Channel::operator!=((Channel *)text,local_88);
    Channel::~Channel(local_88);
    Channel::~Channel((Channel *)text);
    iVar4 = iVar4 + (uVar1 & 0xff);
  }
  if (iVar4 == 0) {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  else {
    lVar5 = 0;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      AnalyzerSettingInterfaceChannel::GetChannel();
      Channel::operator=((this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5,(Channel *)text);
      Channel::~Channel((Channel *)text);
      lVar5 = lVar5 + 0x10;
    }
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mClockChannel,(Channel *)text);
    Channel::~Channel((Channel *)text);
    dVar6 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mClockEdge = (ParallelAnalyzerClockEdge)(long)dVar6;
    AnalyzerSettings::ClearChannels();
    lVar5 = 0;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      sprintf(text,"D%d",uVar3 & 0xffffffff);
      this_00 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                super__Vector_impl_data._M_start + lVar5;
      Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
      Channel::operator!=(this_00,local_88);
      AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,SUB81((Channel *)text,0));
      Channel::~Channel(local_88);
      lVar5 = lVar5 + 0x10;
    }
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  }
  return iVar4 != 0;
}

Assistant:

bool SimpleParallelAnalyzerSettings::SetSettingsFromInterfaces()
{
    U32 count = mDataChannels.size();
    U32 num_used_channels = 0;
    for( U32 i = 0; i < count; i++ )
    {
        if( mDataChannelsInterface[ i ]->GetChannel() != UNDEFINED_CHANNEL )
            num_used_channels++;
    }

    if( num_used_channels == 0 )
    {
        SetErrorText( "Please select at least one channel to use in the parallel bus" );
        return false;
    }

    for( U32 i = 0; i < count; i++ )
    {
        mDataChannels[ i ] = mDataChannelsInterface[ i ]->GetChannel();
    }

    mClockChannel = mClockChannelInterface->GetChannel();
    mClockEdge = static_cast<ParallelAnalyzerClockEdge>( U32( mClockEdgeInterface->GetNumber() ) );

    ClearChannels();
    for( U32 i = 0; i < count; i++ )
    {
        char text[ 64 ];
        sprintf( text, "D%d", i );
        AddChannel( mDataChannels[ i ], text, mDataChannels[ i ] != UNDEFINED_CHANNEL );
    }

    AddChannel( mClockChannel, "Clock", true );

    return true;
}